

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O0

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int extraout_EAX;
  BasicBlock *pBVar1;
  Expr *expr;
  Value *condValue;
  Stmt *pSVar2;
  undefined4 in_register_00000034;
  Value *cond;
  string local_b0;
  BasicBlock *local_90;
  BasicBlock *contBlock;
  string local_80;
  BasicBlock *local_60;
  BasicBlock *falseBlock;
  allocator<char> local_41;
  string local_40;
  BasicBlock *local_20;
  BasicBlock *trueBlock;
  CondStmt *condStmt_local;
  IRGenerator *this_local;
  
  trueBlock = (BasicBlock *)CONCAT44(in_register_00000034,__fd);
  condStmt_local = (CondStmt *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"trueBlock",&local_41);
  pBVar1 = IRBuilder::createBlock(&this->super_IRBuilder,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_20 = pBVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"falseBlock",(allocator<char> *)((long)&contBlock + 7));
  pBVar1 = IRBuilder::createBlock(&this->super_IRBuilder,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)((long)&contBlock + 7));
  local_60 = pBVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"contBlock",(allocator<char> *)((long)&cond + 7));
  pBVar1 = IRBuilder::createBlock(&this->super_IRBuilder,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cond + 7));
  local_90 = pBVar1;
  expr = CondStmt::condition((CondStmt *)trueBlock);
  condValue = codegen(this,expr);
  IRBuilder::createCondBr(&this->super_IRBuilder,condValue,local_20,local_60);
  IRBuilder::setInsertPoint(&this->super_IRBuilder,local_20);
  pSVar2 = CondStmt::thenStmt((CondStmt *)trueBlock);
  codegen(this,pSVar2);
  IRBuilder::createBr(&this->super_IRBuilder,local_90);
  IRBuilder::setInsertPoint(&this->super_IRBuilder,local_60);
  pSVar2 = CondStmt::elseStmt((CondStmt *)trueBlock);
  codegen(this,pSVar2);
  IRBuilder::createBr(&this->super_IRBuilder,local_90);
  IRBuilder::setInsertPoint(&this->super_IRBuilder,local_90);
  return extraout_EAX;
}

Assistant:

void IRGenerator::accept(CondStmt& condStmt) {
  BasicBlock* trueBlock = createBlock("trueBlock");
  BasicBlock* falseBlock = createBlock("falseBlock");
  BasicBlock* contBlock = createBlock("contBlock");

  Value* cond = codegen(condStmt.condition());
  createCondBr(cond, trueBlock, falseBlock);

  setInsertPoint(trueBlock);
  codegen(condStmt.thenStmt());
  createBr(contBlock);

  setInsertPoint(falseBlock);
  codegen(condStmt.elseStmt());
  createBr(contBlock);

  setInsertPoint(contBlock);
}